

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_helper.c
# Opt level: O3

void helper_crypto_sha256su0_arm(void *vd,void *vm)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint64_t *rm;
  
  uVar2 = *(ulong *)((long)vd + 8);
  uVar4 = (uint)(uVar2 >> 0x20);
  uVar3 = (uint)uVar2;
  uVar1 = *vm;
  uVar5 = (uint)((ulong)*vd >> 0x20);
  *(ulong *)vd = CONCAT44(((uint)(uVar2 >> 3) & 0x1fffffff ^
                          (uVar3 << 0xe | uVar3 >> 0x12) ^ (uVar3 << 0x19 | uVar3 >> 7)) + uVar5,
                          (int)*vd +
                          (uVar5 >> 3 ^
                          (uVar5 << 0xe | uVar5 >> 0x12) ^ (uVar5 << 0x19 | uVar5 >> 7)));
  *(ulong *)((long)vd + 8) =
       CONCAT44((uVar1 >> 3 ^ (uVar1 << 0xe | uVar1 >> 0x12) ^ (uVar1 << 0x19 | uVar1 >> 7)) + uVar4
                ,(uVar4 >> 3 ^ (uVar4 << 0xe | uVar4 >> 0x12) ^ (uVar4 << 0x19 | uVar4 >> 7)) +
                 uVar3);
  return;
}

Assistant:

void HELPER(crypto_sha256su0)(void *vd, void *vm)
{
    uint64_t *rd = vd;
    uint64_t *rm = vm;
    union CRYPTO_STATE d = { .l = { rd[0], rd[1] } };
    union CRYPTO_STATE m = { .l = { rm[0], rm[1] } };

    CR_ST_WORD(d, 0) += s0(CR_ST_WORD(d, 1));
    CR_ST_WORD(d, 1) += s0(CR_ST_WORD(d, 2));
    CR_ST_WORD(d, 2) += s0(CR_ST_WORD(d, 3));
    CR_ST_WORD(d, 3) += s0(CR_ST_WORD(m, 0));

    rd[0] = d.l[0];
    rd[1] = d.l[1];
}